

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::HlslParseContext::handleDotDereference
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *base,TString *field)

{
  pointer *pptVar1;
  iterator __position;
  TString name;
  TString name_00;
  TString name_01;
  TString structName;
  TString structName_00;
  TString structName_01;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  TBasicType TVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar8;
  undefined4 extraout_var_01;
  TIntermTyped *pTVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar10;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  TIntermConstantUnion *pTVar11;
  TIntermTyped *pTVar12;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TPoolAllocator *pTVar13;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long lVar14;
  undefined4 extraout_var_11;
  _func_int **pp_Var15;
  undefined4 extraout_var_12;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  TOperator op;
  TType *pTVar19;
  HlslParseContext *this_01;
  TIntermediate *pTVar20;
  char *__end_1;
  long lVar21;
  char *__end;
  undefined7 uStack_29f;
  undefined8 local_290;
  TSwizzleSelectors<int> selectors;
  TIntermTyped *base_local;
  TType type;
  TPoolAllocator *local_1b8;
  undefined1 *local_1b0;
  undefined1 local_1a0 [16];
  TPoolAllocator *local_190;
  undefined1 *local_188;
  undefined1 local_178 [16];
  TPoolAllocator *local_168;
  undefined1 *local_160;
  undefined1 local_150 [16];
  TPoolAllocator *local_140;
  undefined1 *local_138;
  undefined1 local_128 [16];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_118 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_f0 [40];
  TType vectorType;
  undefined4 extraout_var_05;
  
  base_local = base;
  variableCheck(this,&base_local);
  pTVar9 = base_local;
  iVar4 = (*(base_local->super_TIntermNode)._vptr_TIntermNode[0x2a])(base_local);
  if ((char)iVar4 != '\0') {
    pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar17 = "cannot apply to an array:";
    pcVar16 = ".";
    type._8_8_ = (field->_M_dataplus)._M_p;
LAB_0037dadc:
    (*pp_Var15[0x2d])(this,loc,pcVar17,pcVar16,type._8_8_);
    return pTVar9;
  }
  iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
  iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x38))
                    ((long *)CONCAT44(extraout_var,iVar4));
  pp_Var15 = (pTVar9->super_TIntermNode)._vptr_TIntermNode;
  if (iVar4 == 0xe) {
    iVar4 = (*pp_Var15[0x1e])();
    lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x40))
                      ((long *)CONCAT44(extraout_var_00,iVar4));
    if (((*(byte *)(lVar8 + 2) & 0x28) == 0) &&
       (iVar4 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (field,"mips"), iVar4 == 0)) {
      type.qualifier.semanticName = *(char **)&loc->column;
      type._vptr_TType = (_func_int **)loc->name;
      type._8_4_ = loc->string;
      type._12_4_ = loc->line;
      type.qualifier._8_8_ = 0;
      __position._M_current =
           (this->mipsOperatorMipArg).
           super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
           .
           super__Vector_base<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (this->mipsOperatorMipArg).
          super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
          .
          super__Vector_base<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        *(char **)&((__position._M_current)->loc).column = type.qualifier.semanticName;
        (__position._M_current)->mipLevel = (TIntermTyped *)0x0;
        ((__position._M_current)->loc).name = (TString *)type._vptr_TType;
        ((__position._M_current)->loc).string = type._8_4_;
        ((__position._M_current)->loc).line = type._12_4_;
        pptVar1 = &(this->mipsOperatorMipArg).
                   super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                   .
                   super__Vector_base<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
        return pTVar9;
      }
      std::
      vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
      ::_M_realloc_insert<glslang::HlslParseContext::tMipsOperatorData>
                (&(this->mipsOperatorMipArg).
                  super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                 ,__position,(tMipsOperatorData *)&type);
      return pTVar9;
    }
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(field,"mips");
    if (iVar4 == 0) {
      iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
      local_1b8 = GetThreadPoolAllocator();
      local_1b0 = local_1a0;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_1b8,"","");
      local_140 = GetThreadPoolAllocator();
      local_138 = local_128;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_140,"","");
      uStack_29f = (undefined7)((ulong)&local_140 >> 8);
      name_00._M_dataplus._M_p._0_1_ =
           (char)(basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_140;
      name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_1b8;
      name_00._M_dataplus._M_p._1_7_ = uStack_29f;
      name_00._M_string_length = (size_type)loc;
      name_00.field_2._M_allocated_capacity = local_290;
      name_00.field_2._8_4_ = selectors.size_;
      name_00.field_2._12_4_ = selectors.components[0];
      structName_00._4_28_ = stack0xfffffffffffffd84;
      structName_00._M_dataplus.super_allocator_type.allocator._0_4_ = selectors.components[1];
      structName_00.field_2._8_8_ = base_local;
      TType::getCompleteString
                ((TString *)&type,(TType *)CONCAT44(extraout_var_02,iVar4),false,true,true,true,
                 name_00,structName_00);
      pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar17 = "unexpected texture type for .mips[][] operator:";
      pcVar16 = (char *)type._8_8_;
      type._8_8_ = "";
    }
    else {
      pcVar16 = (field->_M_dataplus)._M_p;
      iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
      local_168 = GetThreadPoolAllocator();
      local_160 = local_150;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_168,"","");
      local_190 = GetThreadPoolAllocator();
      local_188 = local_178;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_190,"","");
      uStack_29f = (undefined7)((ulong)&local_190 >> 8);
      name._M_dataplus._M_p._0_1_ =
           (char)(basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_190;
      name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_168;
      name._M_dataplus._M_p._1_7_ = uStack_29f;
      name._M_string_length = (size_type)loc;
      name.field_2._M_allocated_capacity = (size_type)pcVar16;
      name.field_2._8_4_ = selectors.size_;
      name.field_2._12_4_ = selectors.components[0];
      structName._4_28_ = stack0xfffffffffffffd84;
      structName._M_dataplus.super_allocator_type.allocator._0_4_ = selectors.components[1];
      structName.field_2._8_8_ = base_local;
      TType::getCompleteString
                ((TString *)&type,(TType *)CONCAT44(extraout_var_01,iVar4),false,true,true,true,name
                 ,structName);
      pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar17 = "unexpected operator on texture type:";
    }
    goto LAB_0037dadc;
  }
  iVar4 = (*pp_Var15[0x2b])(pTVar9);
  if (((char)iVar4 == '\0') &&
     (iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x2c])(pTVar9), (char)iVar4 == '\0'))
  {
    iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x29])(pTVar9);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9);
      if ((iVar4 == 0xf) ||
         (iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9), iVar4 == 0x10)) {
        iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
        plVar10 = (long *)CONCAT44(extraout_var_05,iVar4);
        cVar3 = (**(code **)(*plVar10 + 0x128))(plVar10);
        if (cVar3 == '\0') {
          __assert_fail("isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                        ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
        }
        lVar8 = plVar10[0xd];
        lVar14 = *(long *)(lVar8 + 8);
        if (0 < (int)((ulong)(*(long *)(lVar8 + 0x10) - lVar14) >> 5)) {
          lVar18 = 0;
          lVar21 = 0;
          do {
            this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(**(long **)(lVar14 + lVar18) + 0x30))();
            iVar4 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(this_00,field);
            if (iVar4 == 0) {
              iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar9);
              iVar7 = (int)lVar21;
              if ((CONCAT44(extraout_var_09,iVar4) != 0) &&
                 (bVar2 = wasFlattened(this,pTVar9), bVar2)) {
                pTVar9 = flattenAccess(this,pTVar9,iVar7);
                return pTVar9;
              }
              iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
              lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar4) + 0x58))
                                 ((long *)CONCAT44(extraout_var_10,iVar4));
              pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              if ((*(uint *)(lVar14 + 8) & 0x7f) == 2) {
                pTVar9 = TIntermediate::foldDereference(pTVar20,pTVar9,iVar7,loc);
                return pTVar9;
              }
              pTVar11 = TIntermediate::addConstantUnion(pTVar20,iVar7,loc,false);
              pTVar9 = TIntermediate::addIndex
                                 ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                  EOpIndexDirectStruct,pTVar9,&pTVar11->super_TIntermTyped,loc);
              pTVar19 = *(TType **)(*(long *)(lVar8 + 8) + lVar18);
              pp_Var15 = (pTVar9->super_TIntermNode)._vptr_TIntermNode;
              goto LAB_0037e0af;
            }
            lVar21 = lVar21 + 1;
            lVar14 = *(long *)(lVar8 + 8);
            lVar18 = lVar18 + 0x20;
          } while (lVar21 < (int)((ulong)(*(long *)(lVar8 + 0x10) - lVar14) >> 5));
        }
        pcVar16 = (field->_M_dataplus)._M_p;
        pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar17 = "no such field in structure";
        type._8_8_ = "";
      }
      else {
        pcVar16 = (field->_M_dataplus)._M_p;
        iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
        vectorType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>(local_f0,"",(pool_allocator<char> *)&vectorType)
        ;
        pTVar13 = GetThreadPoolAllocator();
        selectors.size_ = (int)pTVar13;
        selectors.components[0] = (int)((ulong)pTVar13 >> 0x20);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>(local_118,"",(pool_allocator<char> *)&selectors)
        ;
        uStack_29f = (undefined7)((ulong)local_118 >> 8);
        name_01._M_dataplus._M_p._0_1_ = (char)local_118;
        name_01._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_f0;
        name_01._M_dataplus._M_p._1_7_ = uStack_29f;
        name_01._M_string_length = (size_type)loc;
        name_01.field_2._M_allocated_capacity = (size_type)pcVar16;
        name_01.field_2._8_4_ = selectors.size_;
        name_01.field_2._12_4_ = selectors.components[0];
        structName_01._4_28_ = stack0xfffffffffffffd84;
        structName_01._M_dataplus.super_allocator_type.allocator._0_4_ = selectors.components[1];
        structName_01.field_2._8_8_ = base_local;
        TType::getCompleteString
                  ((TString *)&type,(TType *)CONCAT44(extraout_var_08,iVar4),false,true,true,true,
                   name_01,structName_01);
        pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar17 = "does not apply to this type:";
      }
      goto LAB_0037dadc;
    }
    selectors.size_ = 0;
    iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x27])(pTVar9);
    iVar7 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x28])(pTVar9);
    bVar2 = parseMatrixSwizzleSelector
                      (this,loc,field,iVar4,iVar7,
                       (TSwizzleSelectors<glslang::TMatrixSelector> *)&selectors);
    if (!bVar2) {
      return pTVar9;
    }
    pp_Var15 = (pTVar9->super_TIntermNode)._vptr_TIntermNode;
    if (selectors.size_ == 1) {
      iVar4 = (*pp_Var15[0x1e])(pTVar9);
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x58))
                        ((long *)CONCAT44(extraout_var_03,iVar4));
      pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if ((*(ulong *)(lVar8 + 8) & 0x10000007f) != 2) {
        pTVar11 = TIntermediate::addConstantUnion(pTVar20,selectors.components[0],loc,false);
        pTVar12 = TIntermediate::addIndex
                            (pTVar20,EOpIndexDirect,pTVar9,&pTVar11->super_TIntermTyped,loc);
        iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
        TType::TType(&type,(TType *)CONCAT44(extraout_var_11,iVar4),0,false);
        (*(pTVar12->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar12,&type);
        pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar11 = TIntermediate::addConstantUnion(pTVar20,selectors.components[1],loc,false);
        pTVar9 = TIntermediate::addIndex
                           (pTVar20,EOpIndexDirect,pTVar12,&pTVar11->super_TIntermTyped,loc);
        pTVar19 = &vectorType;
        TType::TType(pTVar19,&type,0,false);
        pp_Var15 = (pTVar9->super_TIntermNode)._vptr_TIntermNode;
LAB_0037e0af:
        (*pp_Var15[0x1d])(pTVar9,pTVar19);
        return pTVar9;
      }
      pTVar9 = TIntermediate::foldDereference(pTVar20,pTVar9,selectors.components[0],loc);
      pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar4 = selectors.components[1];
LAB_0037de7a:
      pTVar9 = TIntermediate::foldDereference(pTVar20,pTVar9,iVar4,loc);
      return pTVar9;
    }
    this_01 = (HlslParseContext *)pTVar9;
    iVar4 = (*pp_Var15[0x28])();
    iVar4 = getMatrixComponentsColumn
                      (this_01,iVar4,(TSwizzleSelectors<glslang::TMatrixSelector> *)&selectors);
    if (-1 < iVar4) {
      iVar7 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar7) + 0x58))
                        ((long *)CONCAT44(extraout_var_07,iVar7));
      pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if ((*(ulong *)(lVar8 + 8) & 0x10000007f) != 2) {
        pTVar11 = TIntermediate::addConstantUnion(pTVar20,iVar4,loc,false);
        pTVar12 = TIntermediate::addIndex
                            (pTVar20,EOpIndexDirect,pTVar9,&pTVar11->super_TIntermTyped,loc);
        iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
        TType::TType(&type,(TType *)CONCAT44(extraout_var_12,iVar4),0,false);
        goto LAB_0037de08;
      }
      goto LAB_0037de7a;
    }
    pTVar12 = TIntermediate::addSwizzle<glslang::TMatrixSelector>
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         (TSwizzleSelectors<glslang::TMatrixSelector> *)&selectors,loc);
    pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    op = EOpMatrixSwizzle;
  }
  else {
    selectors.size_ = 0;
    uVar5 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x26])(pTVar9);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x44])
              (this,loc,field,(ulong)uVar5);
    iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x2c])(pTVar9);
    if ((char)iVar4 != '\0') {
      if (selectors.size_ == 1) {
        return pTVar9;
      }
      TVar6 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9);
      pTVar19 = &type;
      TType::TType(pTVar19,TVar6,EvqTemporary,selectors.size_,0,0,false);
LAB_0037da1a:
      pTVar9 = addConstructor(this,loc,pTVar9,pTVar19);
      return pTVar9;
    }
    iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x26])(pTVar9);
    if ((iVar4 == 1) && (1 < selectors.size_)) {
      TVar6 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9);
      TType::TType(&type,TVar6,EvqTemporary,1,0,0,false);
      TVar6 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9);
      pTVar19 = &vectorType;
      TType::TType(pTVar19,TVar6,EvqTemporary,selectors.size_,0,0,false);
      pTVar9 = addConstructor(this,loc,pTVar9,&type);
      goto LAB_0037da1a;
    }
    iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
    lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x58))
                      ((long *)CONCAT44(extraout_var_04,iVar4));
    if ((*(ulong *)(lVar8 + 8) & 0x10000007f) == 2) {
      pTVar9 = TIntermediate::foldSwizzle
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,pTVar9,
                          &selectors,loc);
      return pTVar9;
    }
    pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    if (selectors.size_ == 1) {
      pTVar11 = TIntermediate::addConstantUnion(pTVar20,selectors.components[0],loc,false);
      pTVar12 = TIntermediate::addIndex
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           EOpIndexDirect,pTVar9,&pTVar11->super_TIntermTyped,loc);
      TVar6 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9);
      TType::TType(&type,TVar6,EvqTemporary,1,0,0,false);
      goto LAB_0037de08;
    }
    pTVar12 = TIntermediate::addSwizzle<int>(pTVar20,&selectors,loc);
    pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    op = EOpVectorSwizzle;
  }
  pTVar12 = TIntermediate::addIndex(pTVar20,op,pTVar9,pTVar12,loc);
  TVar6 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9);
  iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
  lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0x58))
                    ((long *)CONCAT44(extraout_var_06,iVar4));
  TType::TType(&type,TVar6,EvqTemporary,*(uint *)(lVar8 + 8) >> 0x19 & 7,selectors.size_,0,0,false);
LAB_0037de08:
  (*(pTVar12->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar12,&type);
  return pTVar12;
}

Assistant:

TIntermTyped* HlslParseContext::handleDotDereference(const TSourceLoc& loc, TIntermTyped* base, const TString& field)
{
    variableCheck(base);

    if (base->isArray()) {
        error(loc, "cannot apply to an array:", ".", field.c_str());
        return base;
    }

    TIntermTyped* result = base;

    if (base->getType().getBasicType() == EbtSampler) {
        // Handle .mips[mipid][pos] operation on textures
        const TSampler& sampler = base->getType().getSampler();
        if (sampler.isTexture() && field == "mips") {
            // Push a null to signify that we expect a mip level under operator[] next.
            mipsOperatorMipArg.push_back(tMipsOperatorData(loc, nullptr));
            // Keep 'result' pointing to 'base', since we expect an operator[] to go by next.
        } else {
            if (field == "mips")
                error(loc, "unexpected texture type for .mips[][] operator:",
                      base->getType().getCompleteString().c_str(), "");
            else
                error(loc, "unexpected operator on texture type:", field.c_str(),
                      base->getType().getCompleteString().c_str());
        }
    } else if (base->isVector() || base->isScalar()) {
        TSwizzleSelectors<TVectorSelector> selectors;
        parseSwizzleSelector(loc, field, base->getVectorSize(), selectors);

        if (base->isScalar()) {
            if (selectors.size() == 1)
                return result;
            else {
                TType type(base->getBasicType(), EvqTemporary, selectors.size());
                return addConstructor(loc, base, type);
            }
        }
        // Use EOpIndexDirect (below) with vec1.x so that it remains l-value (Test/hlsl.swizzle.vec1.comp)
        if (base->getVectorSize() == 1 && selectors.size() > 1) {
            TType scalarType(base->getBasicType(), EvqTemporary, 1);
            TType vectorType(base->getBasicType(), EvqTemporary, selectors.size());
            return addConstructor(loc, addConstructor(loc, base, scalarType), vectorType);
        }

        if (base->getType().getQualifier().isFrontEndConstant())
            result = intermediate.foldSwizzle(base, selectors, loc);
        else {
            if (selectors.size() == 1) {
                TIntermTyped* index = intermediate.addConstantUnion(selectors[0], loc);
                result = intermediate.addIndex(EOpIndexDirect, base, index, loc);
                result->setType(TType(base->getBasicType(), EvqTemporary));
            } else {
                TIntermTyped* index = intermediate.addSwizzle(selectors, loc);
                result = intermediate.addIndex(EOpVectorSwizzle, base, index, loc);
                result->setType(TType(base->getBasicType(), EvqTemporary, base->getType().getQualifier().precision,
                                selectors.size()));
            }
        }
    } else if (base->isMatrix()) {
        TSwizzleSelectors<TMatrixSelector> selectors;
        if (! parseMatrixSwizzleSelector(loc, field, base->getMatrixCols(), base->getMatrixRows(), selectors))
            return result;

        if (selectors.size() == 1) {
            // Representable by m[c][r]
            if (base->getType().getQualifier().isFrontEndConstant()) {
                result = intermediate.foldDereference(base, selectors[0].coord1, loc);
                result = intermediate.foldDereference(result, selectors[0].coord2, loc);
            } else {
                result = intermediate.addIndex(EOpIndexDirect, base,
                                               intermediate.addConstantUnion(selectors[0].coord1, loc),
                                               loc);
                TType dereferencedCol(base->getType(), 0);
                result->setType(dereferencedCol);
                result = intermediate.addIndex(EOpIndexDirect, result,
                                               intermediate.addConstantUnion(selectors[0].coord2, loc),
                                               loc);
                TType dereferenced(dereferencedCol, 0);
                result->setType(dereferenced);
            }
        } else {
            int column = getMatrixComponentsColumn(base->getMatrixRows(), selectors);
            if (column >= 0) {
                // Representable by m[c]
                if (base->getType().getQualifier().isFrontEndConstant())
                    result = intermediate.foldDereference(base, column, loc);
                else {
                    result = intermediate.addIndex(EOpIndexDirect, base, intermediate.addConstantUnion(column, loc),
                                                   loc);
                    TType dereferenced(base->getType(), 0);
                    result->setType(dereferenced);
                }
            } else {
                // general case, not a column, not a single component
                TIntermTyped* index = intermediate.addSwizzle(selectors, loc);
                result = intermediate.addIndex(EOpMatrixSwizzle, base, index, loc);
                result->setType(TType(base->getBasicType(), EvqTemporary, base->getType().getQualifier().precision,
                                      selectors.size()));
           }
        }
    } else if (base->getBasicType() == EbtStruct || base->getBasicType() == EbtBlock) {
        const TTypeList* fields = base->getType().getStruct();
        bool fieldFound = false;
        int member;
        for (member = 0; member < (int)fields->size(); ++member) {
            if ((*fields)[member].type->getFieldName() == field) {
                fieldFound = true;
                break;
            }
        }
        if (fieldFound) {
            if (base->getAsSymbolNode() && wasFlattened(base)) {
                result = flattenAccess(base, member);
            } else {
                if (base->getType().getQualifier().storage == EvqConst)
                    result = intermediate.foldDereference(base, member, loc);
                else {
                    TIntermTyped* index = intermediate.addConstantUnion(member, loc);
                    result = intermediate.addIndex(EOpIndexDirectStruct, base, index, loc);
                    result->setType(*(*fields)[member].type);
                }
            }
        } else
            error(loc, "no such field in structure", field.c_str(), "");
    } else
        error(loc, "does not apply to this type:", field.c_str(), base->getType().getCompleteString().c_str());

    return result;
}